

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app_writer.c
# Opt level: O1

int write_private_key(mbedtls_pk_context *key,char *output_file)

{
  uint uVar1;
  size_t __n;
  FILE *__s;
  uchar *__ptr;
  uchar output_buf [16000];
  uchar auStack_3e98 [15999];
  undefined1 uStack_19;
  
  __ptr = auStack_3e98;
  memset(auStack_3e98,0,16000);
  if (opt.output_format == 0) {
    uVar1 = mbedtls_pk_write_key_pem(key,auStack_3e98,16000);
    __s = (FILE *)(ulong)uVar1;
    if (uVar1 != 0) goto LAB_0010a9b1;
    __n = strlen((char *)auStack_3e98);
  }
  else {
    uVar1 = mbedtls_pk_write_key_der(key,auStack_3e98,16000);
    __s = (FILE *)(ulong)uVar1;
    if ((int)uVar1 < 0) goto LAB_0010a9b1;
    __n = (size_t)uVar1;
    __ptr = &uStack_19 + -__n;
  }
  __s = fopen(output_file,"w");
  if (__s != (FILE *)0x0) {
    fwrite(__ptr,1,__n,__s);
    uVar1 = fclose(__s);
    __s = (FILE *)(ulong)uVar1;
  }
LAB_0010a9b1:
  return (int)__s;
}

Assistant:

static int write_private_key( mbedtls_pk_context *key, const char *output_file )
{
    int ret;
    FILE *f;
    unsigned char output_buf[16000];
    unsigned char *c = output_buf;
    size_t len = 0;

    memset(output_buf, 0, 16000);

#if defined(MBEDTLS_PEM_WRITE_C)
    if( opt.output_format == OUTPUT_FORMAT_PEM )
    {
        if( ( ret = mbedtls_pk_write_key_pem( key, output_buf, 16000 ) ) != 0 )
            return( ret );

        len = strlen( (char *) output_buf );
    }
    else
#endif
    {
        if( ( ret = mbedtls_pk_write_key_der( key, output_buf, 16000 ) ) < 0 )
            return( ret );

        len = ret;
        c = output_buf + sizeof(output_buf) - len - 1;
    }

    if( ( f = fopen( output_file, "w" ) ) == NULL )
        return( -1 );

    if( fwrite( c, 1, len, f ) != len )
    {
        fclose( f );
        return( -1 );
    }

    fclose( f );

    return( 0 );
}